

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

double __thiscall
bgui::ImageAdapter<float>::getPixel(ImageAdapter<float> *this,float x,float y,int c)

{
  float x_00;
  float y_00;
  int iVar1;
  size_type sVar2;
  int *piVar3;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar4;
  work_t wVar5;
  store_t_conflict1 sVar6;
  double dVar7;
  float in_XMM1_Da;
  double f;
  double ret;
  int ds;
  int j;
  undefined8 in_stack_ffffffffffffffd0;
  int iVar8;
  double local_8;
  
  sVar2 = std::
          vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
          ::size((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                  *)(in_RDI + 0x90));
  if (sVar2 == 0) {
    sVar6 = gimage::Image<float,_gimage::PixelTraits<float>_>::get
                      (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70),
                       (long)in_XMM0_Da,(long)in_XMM1_Da,in_ESI);
    local_8 = (double)sVar6;
  }
  else {
    log(1.0 / *(double *)(in_RDI + 0x48));
    log(2.0);
    sVar2 = std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::size((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    *)(in_RDI + 0x90));
    x_00 = (float)((int)sVar2 + -1);
    piVar3 = std::min<int>((int *)&stack0xffffffffffffffdc,(int *)&stack0xffffffffffffffe0);
    iVar8 = *piVar3;
    y_00 = (float)(1 << ((char)iVar8 + 1U & 0x1f));
    iVar1 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    if (iVar8 < 0) {
      fVar4 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                        ((Image<float,_gimage::PixelTraits<float>_> *)CONCAT44(in_ESI,iVar8),x_00,
                         y_00,iVar1);
    }
    else {
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[]((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    *)(in_RDI + 0x90),(long)iVar8);
      fVar4 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                        ((Image<float,_gimage::PixelTraits<float>_> *)CONCAT44(in_ESI,iVar8),x_00,
                         y_00,iVar1);
    }
    local_8 = (double)fVar4;
    if (((-1 < iVar8 + 1) &&
        (iVar1 = iVar8 + 1,
        sVar2 = std::
                vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                ::size((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                        *)(in_RDI + 0x90)), iVar1 < (int)sVar2)) &&
       (dVar7 = (1.0 / *(double *)(in_RDI + 0x48) - (double)(int)y_00) / (double)(int)y_00,
       1e-06 < dVar7)) {
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[]((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                    *)(in_RDI + 0x90),(long)(iVar8 + 1));
      wVar5 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                        ((Image<float,_gimage::PixelTraits<float>_> *)CONCAT44(in_ESI,iVar8),x_00,
                         y_00,(int)((ulong)local_8 >> 0x20));
      local_8 = (1.0 - dVar7) * local_8 + dVar7 * (double)wVar5;
    }
  }
  return local_8;
}

Assistant:

double getPixel(float x, float y, int c) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);
        double ret;

        if (j < 0)
        {
          ret=image->getBilinear(x, y, c);
        }
        else
        {
          ret=mipmap[j].getBilinear(x/ds, y/ds, c);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            ret=(1-f)*ret+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), c);
          }
        }

        return ret;
      }

      return image->get(static_cast<long>(x), static_cast<long>(y), c);
    }